

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag_no_value.hpp
# Opt level: O2

string_t * __thiscall
cfgfile::tag_no_value_t<cfgfile::string_trait_t>::print_abi_cxx11_
          (string_t *__return_storage_ptr__,tag_no_value_t<cfgfile::string_trait_t> *this,int indent
          )

{
  undefined8 *puVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char cVar4;
  undefined8 *puVar5;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  bVar2 = tag_t<cfgfile::string_trait_t>::is_defined(&this->super_tag_t<cfgfile::string_trait_t>);
  if (bVar2) {
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct((ulong)local_50,(char)indent);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)local_50);
    cVar4 = (char)__return_storage_ptr__;
    std::__cxx11::string::push_back(cVar4);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    iVar3 = (*(this->super_tag_t<cfgfile::string_trait_t>)._vptr_tag_t[2])(this);
    if (*(long *)CONCAT44(extraout_var,iVar3) != ((long *)CONCAT44(extraout_var,iVar3))[1]) {
      std::__cxx11::string::push_back(cVar4);
      iVar3 = (*(this->super_tag_t<cfgfile::string_trait_t>)._vptr_tag_t[2])(this);
      puVar1 = (undefined8 *)((undefined8 *)CONCAT44(extraout_var_00,iVar3))[1];
      for (puVar5 = *(undefined8 **)CONCAT44(extraout_var_00,iVar3); puVar5 != puVar1;
          puVar5 = puVar5 + 1) {
        (**(code **)(*(long *)*puVar5 + 0x18))((string *)local_50,(long *)*puVar5,indent + 1);
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)local_50);
      }
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct((ulong)local_50,(char)indent);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)local_50);
    }
    std::__cxx11::string::push_back(cVar4);
    std::__cxx11::string::push_back(cVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

typename Trait::string_t print( int indent = 0 ) const override
	{
		typename Trait::string_t result;

		if( this->is_defined() )
		{
			result.append( typename Trait::string_t( indent,
				const_t< Trait >::c_tab ) );

			result.push_back( const_t< Trait >::c_begin_tag );
			result.append( this->name() );

			if( !this->children().empty() )
			{
				result.push_back( const_t< Trait >::c_carriage_return );

				for( const tag_t< Trait > * tag : this->children() )
					result.append( tag->print( indent + 1 ) );

				result.append( typename Trait::string_t( indent,
					const_t< Trait >::c_tab ) );
			}

			result.push_back( const_t< Trait >::c_end_tag );
			result.push_back( const_t< Trait >::c_carriage_return );
		}

		return result;
	}